

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O0

void lj_mcode_free(jit_State *J)

{
  undefined8 *puVar1;
  long in_RDI;
  size_t sz;
  MCode *next;
  MCode *mc;
  void *in_stack_ffffffffffffffd8;
  jit_State *J_00;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 0x9c8);
  *(undefined8 *)(in_RDI + 0x9c8) = 0;
  *(undefined8 *)(in_RDI + 0x9e8) = 0;
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    J_00 = (jit_State *)local_10[1];
    lj_err_deregister_mcode(J_00,(size_t)in_stack_ffffffffffffffd8,(uint8_t *)0x199515);
    mcode_free(J_00,in_stack_ffffffffffffffd8,0x199529);
    local_10 = puVar1;
  }
  return;
}

Assistant:

void lj_mcode_free(jit_State *J)
{
  MCode *mc = J->mcarea;
  J->mcarea = NULL;
  J->szallmcarea = 0;
  while (mc) {
    MCode *next = ((MCLink *)mc)->next;
    size_t sz = ((MCLink *)mc)->size;
    lj_err_deregister_mcode(mc, sz, (uint8_t *)mc + sizeof(MCLink));
    mcode_free(J, mc, sz);
    mc = next;
  }
}